

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::Psbt::GetGlobalRecordKeyList
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,Psbt *this)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  pvVar1 = this->wally_psbt_pointer_;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 8;
  for (uVar4 = 0; uVar4 < *(ulong *)((long)pvVar1 + 0x48); uVar4 = uVar4 + 1) {
    lVar2 = *(long *)((long)pvVar1 + 0x40);
    ByteData::ByteData((ByteData *)&local_40,*(uint8_t **)(lVar2 + -8 + lVar3),
                       *(uint32_t *)(lVar2 + lVar3));
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(__return_storage_ptr__,(ByteData *)&local_40);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    lVar3 = lVar3 + 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> Psbt::GetGlobalRecordKeyList() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  std::vector<ByteData> result;
  for (size_t idx = 0; idx < psbt_pointer->unknowns.num_items; ++idx) {
    auto item = &psbt_pointer->unknowns.items[idx];
    result.emplace_back(
        ByteData(item->key, static_cast<uint32_t>(item->key_len)));
  }
  return result;
}